

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

Vec_Int_t * Vec_IntTwoMerge(Vec_Int_t *vArr1,Vec_Int_t *vArr2)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  
  iVar7 = vArr1->nSize;
  iVar3 = vArr2->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < (iVar7 + iVar3) - 1U) {
    iVar6 = iVar7 + iVar3;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar6;
  if (iVar6 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar6 << 2);
  }
  pVVar4->pArray = piVar5;
  piVar10 = vArr1->pArray;
  piVar9 = vArr2->pArray;
  piVar1 = piVar10 + iVar7;
  piVar2 = piVar9 + iVar3;
  piVar8 = piVar5;
  if (0 < iVar3 && 0 < iVar7) {
    do {
      iVar7 = *piVar10;
      iVar3 = *piVar9;
      if (iVar7 == iVar3) {
        piVar10 = piVar10 + 1;
        *piVar8 = iVar7;
        piVar9 = piVar9 + 1;
      }
      else if (iVar7 < iVar3) {
        piVar10 = piVar10 + 1;
        *piVar8 = iVar7;
      }
      else {
        piVar9 = piVar9 + 1;
        *piVar8 = iVar3;
      }
      piVar8 = piVar8 + 1;
    } while ((piVar10 < piVar1) && (piVar9 < piVar2));
  }
  for (; piVar10 < piVar1; piVar10 = piVar10 + 1) {
    *piVar8 = *piVar10;
    piVar8 = piVar8 + 1;
  }
  for (; piVar9 < piVar2; piVar9 = piVar9 + 1) {
    *piVar8 = *piVar9;
    piVar8 = piVar8 + 1;
  }
  iVar7 = (int)((ulong)((long)piVar8 - (long)piVar5) >> 2);
  pVVar4->nSize = iVar7;
  if (pVVar4->nCap < iVar7) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x72c,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar7 < vArr1->nSize) {
    __assert_fail("vArr->nSize >= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x72d,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar7 < vArr2->nSize) {
    __assert_fail("vArr->nSize >= vArr2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x72e,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  return pVVar4;
}

Assistant:

static inline Vec_Int_t * Vec_IntTwoMerge( Vec_Int_t * vArr1, Vec_Int_t * vArr2 )
{
    Vec_Int_t * vArr = Vec_IntAlloc( vArr1->nSize + vArr2->nSize ); 
    Vec_IntTwoMerge2Int( vArr1, vArr2, vArr );
    return vArr;
}